

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,BinaryOperator *b)

{
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  Constant *pCVar4;
  BinaryOperator *__return_storage_ptr__;
  pool_ptr<soul::AST::Constant> rhsConst;
  pool_ptr<soul::AST::Constant> lhsConst;
  Type resultType;
  Value result;
  pool_ptr<soul::AST::Constant> local_110;
  pool_ptr<soul::AST::Constant> local_108;
  anon_class_8_1_54a39802 local_100;
  undefined1 local_f8 [88];
  Value local_a0;
  Value local_60;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,b);
  bVar2 = ErrorIgnoringRewritingASTVisitor::failIfNotResolved
                    (&this->super_ErrorIgnoringRewritingASTVisitor,&b->super_Expression);
  if (bVar2) {
    return &b->super_Expression;
  }
  SanityCheckPass::throwErrorIfNotReadableValue((b->rhs).object);
  iVar3 = (*(b->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[9])(b);
  if ((char)iVar3 != '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
    return &b->super_Expression;
  }
  SanityCheckPass::throwErrorIfNotReadableValue((b->lhs).object);
  __return_storage_ptr__ = (BinaryOperator *)local_f8;
  AST::BinaryOperator::getOperandType((Type *)__return_storage_ptr__,b);
  if (((local_f8[0] != '\0') &&
      ((*(((b->lhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_108),
      local_108.object != (Constant *)0x0)) &&
     ((*(((b->rhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_110),
     local_110.object != (Constant *)0x0)) {
    pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_108);
    soul::Value::Value((Value *)(local_f8 + 0x18),&pCVar4->value);
    pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_110);
    soul::Value::Value(&local_60,&pCVar4->value);
    local_100.b = b;
    bVar2 = BinaryOp::
            apply<soul::ResolutionPass::ConstantFolder::visit(soul::AST::BinaryOperator&)::_lambda(soul::CompileMessage)_1_>
                      ((Value *)(local_f8 + 0x18),&local_60,b->operation,&local_100);
    soul::Value::~Value(&local_60);
    if (bVar2) {
      soul::Value::Value(&local_a0,(Value *)(local_f8 + 0x18));
      __return_storage_ptr__ =
           (BinaryOperator *)
           createConstant(this,&(b->super_Expression).super_Statement.super_ASTObject.context,
                          &local_a0);
      soul::Value::~Value(&local_a0);
    }
    soul::Value::~Value((Value *)(local_f8 + 0x18));
    if (bVar2) goto LAB_0024d1d0;
  }
  __return_storage_ptr__ = b;
LAB_0024d1d0:
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)(local_f8 + 0x10));
  return &__return_storage_ptr__->super_Expression;
}

Assistant:

AST::Expression& visit (AST::BinaryOperator& b) override
        {
            super::visit (b);

            if (failIfNotResolved (b))
                return b;

            SanityCheckPass::throwErrorIfNotReadableValue (b.rhs);

            if (b.isOutputEndpoint())
            {
                ++numFails;
                return b;
            }

            SanityCheckPass::throwErrorIfNotReadableValue (b.lhs);
            auto resultType = b.getOperandType();

            if (resultType.isValid())
            {
                if (auto lhsConst = b.lhs->getAsConstant())
                {
                    if (auto rhsConst = b.rhs->getAsConstant())
                    {
                        auto result = lhsConst->value;

                        if (BinaryOp::apply (result, rhsConst->value, b.operation,
                                             [&] (CompileMessage message) { b.context.throwError (message); }))
                            return createConstant (b.context, std::move (result));
                    }
                }
            }

            return b;
        }